

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int new_localvar(LexState *ls,TString *name)

{
  int iVar1;
  lua_State *L_00;
  FuncState *fs_00;
  Dyndata *pDVar2;
  Vardesc *pVVar3;
  Vardesc *var;
  Dyndata *dyd;
  FuncState *fs;
  lua_State *L;
  TString *name_local;
  LexState *ls_local;
  
  L_00 = ls->L;
  fs_00 = ls->fs;
  pDVar2 = ls->dyd;
  checklimit(fs_00,((pDVar2->actvar).n + 1) - fs_00->firstlocal,200,"local variables");
  pVVar3 = (Vardesc *)
           luaM_growaux_(L_00,(pDVar2->actvar).arr,(pDVar2->actvar).n + 1,&(pDVar2->actvar).size,
                         0x18,0x7fff,"local variables");
  (pDVar2->actvar).arr = pVVar3;
  pVVar3 = (pDVar2->actvar).arr;
  iVar1 = (pDVar2->actvar).n;
  (pDVar2->actvar).n = iVar1 + 1;
  (&pVVar3->vd)[iVar1].kind = '\0';
  (&pVVar3->vd)[iVar1].name = name;
  return ((pDVar2->actvar).n + -1) - fs_00->firstlocal;
}

Assistant:

static int new_localvar (LexState *ls, TString *name) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  Vardesc *var;
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                 MAXVARS, "local variables");
  luaM_growvector(L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, SHRT_MAX, "local variables");
  var = &dyd->actvar.arr[dyd->actvar.n++];
  var->vd.kind = VDKREG;  /* default */
  var->vd.name = name;
  return dyd->actvar.n - 1 - fs->firstlocal;
}